

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifund(bifcxdef *ctx,int argc)

{
  int iVar1;
  undefined8 *in_RDI;
  bool bVar2;
  errdef fr_;
  runsdef val;
  int undone;
  int err;
  errcxdef *ec;
  mcmcxdef *mcx;
  objucxdef *ucx;
  errdef *in_stack_fffffffffffffe88;
  objucxdef *undoctx;
  uint in_stack_fffffffffffffe94;
  dattyp in_stack_fffffffffffffe9c;
  runcxdef *in_stack_fffffffffffffea0;
  __jmp_buf_tag _Stack_108;
  uint local_30;
  int local_2c;
  undefined8 *local_28;
  undefined8 local_20;
  long local_18;
  undefined8 *local_8;
  
  local_18 = *(long *)(*(long *)(in_RDI[1] + 0x70) + 0x20);
  local_20 = *(undefined8 *)(in_RDI[1] + 8);
  local_28 = (undefined8 *)*in_RDI;
  local_8 = in_RDI;
  iVar1 = _setjmp(&_Stack_108);
  if (iVar1 == 0) {
    undoctx = (objucxdef *)*local_28;
    *local_28 = &stack0xfffffffffffffe88;
    bVar2 = local_18 != 0;
    if (bVar2) {
      objundo((mcmcxdef *)((ulong)in_stack_fffffffffffffe94 << 0x20),undoctx);
    }
    local_30 = (uint)bVar2;
    *local_28 = undoctx;
  }
  else {
    *local_28 = in_stack_fffffffffffffe88;
    local_2c = iVar1;
    if ((iVar1 != 0xc9) && (iVar1 != 0xca)) {
      errrse1((errcxdef *)CONCAT44(in_stack_fffffffffffffe94,iVar1),in_stack_fffffffffffffe88);
    }
    local_30 = 0;
  }
  runpush(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
          (runsdef *)CONCAT44(in_stack_fffffffffffffe94,iVar1));
  *(byte *)(*(long *)(local_8[1] + 0x70) + 0x119a) =
       *(byte *)(*(long *)(local_8[1] + 0x70) + 0x119a) | 1;
  return;
}

Assistant:

void bifund(bifcxdef *ctx, int argc)
{
    objucxdef *ucx = ctx->bifcxrun->runcxvoc->voccxundo;
    mcmcxdef  *mcx = ctx->bifcxrun->runcxmem;
    errcxdef  *ec  = ctx->bifcxerr;
    int        err;
    int        undone;
    runsdef    val;

    bifcntargs(ctx, 0, argc);                               /* no arguments */

    ERRBEGIN(ec)
        if (ucx)
        {
            objundo(mcx, ucx);         /* try to undo to previous savepoint */
            undone = TRUE;                       /* looks like we succeeded */
        }
        else
            undone = FALSE;                  /* no undo context; can't undo */
    ERRCATCH(ec, err)
        if (err == ERR_NOUNDO || err == ERR_ICUNDO)
            undone = FALSE;
        else
            errrse(ec);            /* don't know how to handle other errors */
    ERREND(ec)

    /* return a value indicating whether the undo operation succeeded */
    runpush(ctx->bifcxrun, runclog(undone), &val);

    /* note that the rest of the command line is to be ignored */
    ctx->bifcxrun->runcxvoc->voccxflg |= VOCCXFCLEAR;
}